

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::NetAlias>::emplace_back<slang::ast::NetAlias>
          (SmallVectorBase<slang::ast::NetAlias> *this,NetAlias *args)

{
  unsigned_long *puVar1;
  ulong uVar2;
  pointer p;
  ValueSymbol *pVVar3;
  Expression *pEVar4;
  unsigned_long uVar5;
  pointer pNVar6;
  pointer pNVar7;
  pointer pNVar8;
  long lVar9;
  long lVar10;
  pointer __src;
  size_type sVar11;
  ulong uVar12;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    pVVar3 = (args->sym).ptr;
    pEVar4 = (args->expr).ptr;
    uVar5 = (args->bounds).second;
    (__src->bounds).first = (args->bounds).first;
    (__src->bounds).second = uVar5;
    (__src->sym).ptr = pVVar3;
    (__src->expr).ptr = pEVar4;
    sVar11 = this->len;
    this->len = sVar11 + 1;
    return this->data_ + sVar11;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar2 = this->cap;
  if (uVar12 < uVar2 * 2) {
    uVar12 = uVar2 * 2;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    uVar12 = 0x3ffffffffffffff;
  }
  lVar10 = (long)__src - (long)this->data_;
  pNVar6 = (pointer)operator_new(uVar12 << 5);
  pVVar3 = (args->sym).ptr;
  pEVar4 = (args->expr).ptr;
  uVar5 = (args->bounds).second;
  puVar1 = (unsigned_long *)((long)pNVar6 + lVar10 + 0x10);
  *puVar1 = (args->bounds).first;
  puVar1[1] = uVar5;
  *(undefined8 *)((long)pNVar6 + lVar10) = pVVar3;
  ((undefined8 *)((long)pNVar6 + lVar10))[1] = pEVar4;
  p = this->data_;
  sVar11 = this->len;
  lVar9 = (long)p + (sVar11 * 0x20 - (long)__src);
  pNVar7 = p;
  pNVar8 = pNVar6;
  if (lVar9 == 0) {
    pNVar7 = pNVar6;
    pNVar8 = p;
    if (sVar11 != 0) {
      do {
        pVVar3 = (pNVar8->sym).ptr;
        pEVar4 = (pNVar8->expr).ptr;
        uVar5 = (pNVar8->bounds).second;
        (pNVar7->bounds).first = (pNVar8->bounds).first;
        (pNVar7->bounds).second = uVar5;
        (pNVar7->sym).ptr = pVVar3;
        (pNVar7->expr).ptr = pEVar4;
        pNVar8 = pNVar8 + 1;
        pNVar7 = pNVar7 + 1;
      } while (pNVar8 != __src);
    }
  }
  else {
    for (; pNVar7 != __src; pNVar7 = pNVar7 + 1) {
      pVVar3 = (pNVar7->sym).ptr;
      pEVar4 = (pNVar7->expr).ptr;
      uVar5 = (pNVar7->bounds).second;
      (pNVar8->bounds).first = (pNVar7->bounds).first;
      (pNVar8->bounds).second = uVar5;
      (pNVar8->sym).ptr = pVVar3;
      (pNVar8->expr).ptr = pEVar4;
      pNVar8 = pNVar8 + 1;
    }
    memcpy((void *)((long)pNVar6 + lVar10 + 0x20),__src,(lVar9 - 0x20U & 0xffffffffffffffe0) + 0x20)
    ;
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar11 = this->len;
  }
  this->len = sVar11 + 1;
  this->cap = uVar12;
  this->data_ = pNVar6;
  return (reference)((long)pNVar6 + lVar10);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }